

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::SetMixingColumnsForDeferredRows(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  PeelRow *pPVar6;
  uint64_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint16_t *puVar10;
  uint uVar11;
  uint i;
  long lVar12;
  uint uVar13;
  ushort auStack_36 [3];
  
  puVar10 = &this->_defer_head_rows;
  while( true ) {
    uVar1 = *puVar10;
    uVar9 = (uint)uVar1;
    if (uVar9 == 0xffff) break;
    pPVar6 = this->_peel_rows;
    pPVar6[uVar9].Marks.Unmarked[0] = 0xffff;
    uVar11 = (uint)uVar1 * this->_ge_pitch;
    uVar1 = pPVar6[uVar9].Params.MixFirst;
    uVar8 = (uint)uVar1;
    uVar2 = pPVar6[uVar9].Params.MixAdd;
    puVar7 = this->_compress_matrix;
    uVar3 = this->_defer_count;
    uVar4 = this->_mix_count;
    uVar5 = this->_mix_next_prime;
    for (lVar12 = 1; lVar12 != 3; lVar12 = lVar12 + 1) {
      uVar8 = ((uVar8 & 0xffff) + (uint)uVar2) % (uint)uVar5;
      if (uVar4 <= uVar8) {
        uVar8 = uVar5 - uVar8;
        uVar13 = uVar8 & 0xffff;
        if (uVar2 < (ushort)uVar8) {
          uVar8 = ((uint)uVar2 * 0x10000 - uVar13) % (uint)uVar2;
        }
        else {
          uVar8 = uVar2 - uVar13;
        }
      }
      auStack_36[lVar12] = (ushort)uVar8;
    }
    uVar8 = (uint)uVar1 + (uint)uVar3;
    puVar10 = &pPVar6[uVar9].NextRow;
    puVar7[(ulong)uVar11 + (ulong)(uVar8 >> 6)] =
         puVar7[(ulong)uVar11 + (ulong)(uVar8 >> 6)] ^ 1L << ((ulong)uVar8 & 0x3f);
    uVar9 = (uint)auStack_36[1] + (uint)uVar3;
    puVar7[(ulong)uVar11 + (ulong)(uVar9 >> 6)] =
         puVar7[(ulong)uVar11 + (ulong)(uVar9 >> 6)] ^ 1L << ((ulong)uVar9 & 0x3f);
    puVar7[(ulong)uVar11 + (ulong)((uint)auStack_36[2] + (uint)uVar3 >> 6)] =
         puVar7[(ulong)uVar11 + (ulong)((uint)auStack_36[2] + (uint)uVar3 >> 6)] ^
         1L << ((ulong)((uint)auStack_36[2] + (uint)uVar3) & 0x3f);
  }
  return;
}

Assistant:

void Codec::SetMixingColumnsForDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetMixingColumnsForDeferredRows ----" << endl << endl;)

    PeelRow * GF256_RESTRICT row;

    // For each deferred row:
    for (uint16_t defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        defer_row_i = row->NextRow)
    {
        row = &_peel_rows[defer_row_i];

        CAT_IF_DUMP(cout << "Deferred row " << defer_row_i << " set mix columns :";)

        // Mark it as deferred for the following loop
        row->Marks.Result.PeelColumn = LIST_TERM;

        // Set up mixing column generator
        uint64_t *ge_row = _compress_matrix + _ge_pitch * defer_row_i;

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k;)

        CAT_IF_DUMP(cout << endl;)
    }
}